

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O3

maybe<example::aln_t> * __thiscall
rangeless::fn::impl::
catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>
::operator()(maybe<example::aln_t> *__return_storage_ptr__,
            catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>
            *this)

{
  ulong uVar1;
  alns_t *paVar2;
  pointer paVar3;
  maybe<example::aln_t> *in_RAX;
  maybe<example::aln_t> *extraout_RAX;
  undefined8 uVar4;
  undefined1 local_90 [32];
  undefined1 local_70 [96];
  
  if (this->ended == true) {
    __return_storage_ptr__->m_empty = true;
  }
  else {
    uVar1 = (this->gen).i;
    paVar2 = (this->gen).alns;
    paVar3 = (paVar2->super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(paVar2->super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)paVar3 >> 7) <= uVar1) {
      uVar4 = __cxa_allocate_exception(1);
      __cxa_throw(uVar4,&end_seq::exception::typeinfo,0);
    }
    (this->gen).i = uVar1 + 1;
    example::aln_t::aln_t((aln_t *)local_90,paVar3 + uVar1);
    __return_storage_ptr__->m_empty = true;
    maybe<example::aln_t>::reset(__return_storage_ptr__);
    example::aln_t::aln_t((aln_t *)__return_storage_ptr__,(aln_t *)local_90);
    __return_storage_ptr__->m_empty = false;
    if ((undefined1 *)local_70._24_8_ != local_70 + 0x28) {
      operator_delete((void *)local_70._24_8_,local_70._40_8_ + 1);
    }
    in_RAX = (maybe<example::aln_t> *)local_70;
    if ((maybe<example::aln_t> *)local_90._16_8_ != in_RAX) {
      operator_delete((void *)local_90._16_8_,local_70._0_8_ + 1);
      in_RAX = extraout_RAX;
    }
  }
  return in_RAX;
}

Assistant:

auto operator()() -> maybe<value_type>
        {
            if(ended) {
                return { };
            }

            try {
                return { gen() };
            } catch( const end_seq::exception& ) {
                ended = true;
                return { };
            }
        }